

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseSwitchExpr(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  byte local_26a;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> local_248;
  allocator<char> local_239;
  string local_238;
  value_type local_218;
  allocator<char> local_1c9;
  string local_1c8 [32];
  undefined1 local_1a8 [8];
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> caseBody_1;
  unique_ptr<enact::BooleanExpr,_std::default_delete<enact::BooleanExpr>_> local_198;
  undefined1 local_190 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> casePredicate_1;
  unique_ptr<enact::Pattern,_std::default_delete<enact::Pattern>_> casePattern_1;
  Token keyword_1;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> local_140;
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> local_138;
  Token local_130;
  allocator<char> local_f9;
  string local_f8 [32];
  undefined1 local_d8 [8];
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> caseBody;
  unique_ptr<enact::BooleanExpr,_std::default_delete<enact::BooleanExpr>_> local_c8;
  undefined1 local_c0 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> casePredicate;
  unique_ptr<enact::Pattern,_std::default_delete<enact::Pattern>_> local_a8;
  unique_ptr<enact::Pattern,_std::default_delete<enact::Pattern>_> casePattern;
  Token keyword;
  vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> cases;
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> value;
  Parser *this_local;
  
  parseExpr((Parser *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Expected \'{\' before switch expression body.",&local_41);
  expect(in_RSI,LEFT_BRACE,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::vector
            ((vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *)&keyword.line);
  while( true ) {
    bVar1 = check(in_RSI,RIGHT_BRACE);
    local_26a = 0;
    if (!bVar1) {
      bVar1 = isAtEnd(in_RSI);
      local_26a = bVar1 ^ 0xff;
    }
    if ((local_26a & 1) == 0) break;
    bVar1 = consume(in_RSI,CASE);
    if (bVar1) {
      Token::Token((Token *)&casePattern,&in_RSI->m_previous);
      parseExpr((Parser *)&casePredicate);
      std::
      make_unique<enact::ValuePattern,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
                ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)
                 &stack0xffffffffffffff50);
      std::unique_ptr<enact::Pattern,std::default_delete<enact::Pattern>>::
      unique_ptr<enact::ValuePattern,std::default_delete<enact::ValuePattern>,void>
                ((unique_ptr<enact::Pattern,std::default_delete<enact::Pattern>> *)&local_a8,
                 (unique_ptr<enact::ValuePattern,_std::default_delete<enact::ValuePattern>_> *)
                 &stack0xffffffffffffff50);
      std::unique_ptr<enact::ValuePattern,_std::default_delete<enact::ValuePattern>_>::~unique_ptr
                ((unique_ptr<enact::ValuePattern,_std::default_delete<enact::ValuePattern>_> *)
                 &stack0xffffffffffffff50);
      std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr(&casePredicate);
      caseBody._M_t.super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>.
      _M_t.super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
      super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl._6_1_ = 0;
      bVar1 = consume(in_RSI,WHEN);
      if (bVar1) {
        parseExpr((Parser *)local_c0);
      }
      else {
        caseBody._M_t.
        super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
        super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
        super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl._7_1_ = 1;
        std::make_unique<enact::BooleanExpr,bool>((bool *)&local_c8);
        caseBody._M_t.
        super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
        super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
        super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl._6_1_ = 1;
        std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
        unique_ptr<enact::BooleanExpr,std::default_delete<enact::BooleanExpr>,void>
                  ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)local_c0,&local_c8);
      }
      if ((caseBody._M_t.
           super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
           super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
           super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl._6_1_ & 1) != 0) {
        std::unique_ptr<enact::BooleanExpr,_std::default_delete<enact::BooleanExpr>_>::~unique_ptr
                  (&local_c8);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_f8,"Expected \'{\' or \'=>\' before switch case body.",&local_f9);
      expectBlock((Parser *)local_d8,(string *)in_RSI);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator(&local_f9);
      std::unique_ptr<enact::Pattern,_std::default_delete<enact::Pattern>_>::unique_ptr
                ((unique_ptr<enact::Pattern,_std::default_delete<enact::Pattern>_> *)&keyword_1.line
                 ,&local_a8);
      std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr
                (&local_140,(unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_c0);
      std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::unique_ptr
                (&local_138,
                 (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_d8);
      Token::Token(&local_130,(Token *)&casePattern);
      std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::push_back
                ((vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *)&keyword.line,
                 (value_type *)&keyword_1.line);
      SwitchCase::~SwitchCase((SwitchCase *)&keyword_1.line);
      std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::~unique_ptr
                ((unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_d8);
      std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
                ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_c0);
      std::unique_ptr<enact::Pattern,_std::default_delete<enact::Pattern>_>::~unique_ptr(&local_a8);
      Token::~Token((Token *)&casePattern);
    }
    else {
      bVar1 = consume(in_RSI,DEFAULT);
      if (bVar1) {
        Token::Token((Token *)&casePattern_1,&in_RSI->m_previous);
        std::make_unique<enact::WildcardPattern,enact::Token&>((Token *)&casePredicate_1);
        std::unique_ptr<enact::Pattern,std::default_delete<enact::Pattern>>::
        unique_ptr<enact::WildcardPattern,std::default_delete<enact::WildcardPattern>,void>
                  ((unique_ptr<enact::Pattern,std::default_delete<enact::Pattern>> *)
                   &stack0xfffffffffffffe80,
                   (unique_ptr<enact::WildcardPattern,_std::default_delete<enact::WildcardPattern>_>
                    *)&casePredicate_1);
        std::unique_ptr<enact::WildcardPattern,_std::default_delete<enact::WildcardPattern>_>::
        ~unique_ptr((unique_ptr<enact::WildcardPattern,_std::default_delete<enact::WildcardPattern>_>
                     *)&casePredicate_1);
        caseBody_1._M_t.
        super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
        super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
        super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl._6_1_ = 0;
        bVar1 = consume(in_RSI,WHEN);
        if (bVar1) {
          parseExpr((Parser *)local_190);
        }
        else {
          caseBody_1._M_t.
          super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
          super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
          super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl._7_1_ = 1;
          std::make_unique<enact::BooleanExpr,bool>((bool *)&local_198);
          caseBody_1._M_t.
          super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
          super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
          super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl._6_1_ = 1;
          std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
          unique_ptr<enact::BooleanExpr,std::default_delete<enact::BooleanExpr>,void>
                    ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)local_190,
                     &local_198);
        }
        if ((caseBody_1._M_t.
             super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
             super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
             super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl._6_1_ & 1) != 0) {
          std::unique_ptr<enact::BooleanExpr,_std::default_delete<enact::BooleanExpr>_>::~unique_ptr
                    (&local_198);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1c8,"Expected \'{\' or \'=>\' before default switch case body.",&local_1c9)
        ;
        expectBlock((Parser *)local_1a8,(string *)in_RSI);
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator(&local_1c9);
        std::unique_ptr<enact::Pattern,_std::default_delete<enact::Pattern>_>::unique_ptr
                  (&local_218.pattern,
                   (unique_ptr<enact::Pattern,_std::default_delete<enact::Pattern>_> *)
                   &stack0xfffffffffffffe80);
        std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr
                  (&local_218.predicate,
                   (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_190);
        std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::unique_ptr
                  (&local_218.body,
                   (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_1a8
                  );
        Token::Token(&local_218.keyword,(Token *)&casePattern_1);
        std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::push_back
                  ((vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *)&keyword.line,
                   &local_218);
        SwitchCase::~SwitchCase(&local_218);
        std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::~unique_ptr
                  ((unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_1a8
                  );
        std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
                  ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_190);
        std::unique_ptr<enact::Pattern,_std::default_delete<enact::Pattern>_>::~unique_ptr
                  ((unique_ptr<enact::Pattern,_std::default_delete<enact::Pattern>_> *)
                   &stack0xfffffffffffffe80);
        Token::~Token((Token *)&casePattern_1);
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"Expected \'}\' after switch expression body.",&local_239);
  expect(in_RSI,RIGHT_BRACE,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::
  make_unique<enact::SwitchExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::vector<enact::SwitchCase,std::allocator<enact::SwitchCase>>>
            (&local_248,(vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *)local_20);
  std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
  unique_ptr<enact::SwitchExpr,std::default_delete<enact::SwitchExpr>,void>
            ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
             (unique_ptr<enact::SwitchExpr,_std::default_delete<enact::SwitchExpr>_> *)&local_248);
  std::unique_ptr<enact::SwitchExpr,_std::default_delete<enact::SwitchExpr>_>::~unique_ptr
            ((unique_ptr<enact::SwitchExpr,_std::default_delete<enact::SwitchExpr>_> *)&local_248);
  std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::~vector
            ((vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *)&keyword.line);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_20);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseSwitchExpr() {
        std::unique_ptr<Expr> value = parseExpr();
        expect(TokenType::LEFT_BRACE, "Expected '{' before switch expression body.");

        std::vector<SwitchCase> cases;
        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            if (consume(TokenType::CASE)) {
                Token keyword = m_previous;

                // TODO: add more pattern types
                std::unique_ptr<Pattern> casePattern = std::make_unique<ValuePattern>(parseExpr());
                std::unique_ptr<Expr> casePredicate = consume(TokenType::WHEN)
                                                    ? parseExpr()
                                                    : std::make_unique<BooleanExpr>(true);
                std::unique_ptr<BlockExpr> caseBody = expectBlock("Expected '{' or '=>' before switch case body.");

                cases.push_back(SwitchCase{std::move(casePattern), std::move(casePredicate), std::move(caseBody), std::move(keyword)});
            } else if (consume(TokenType::DEFAULT)) {
                Token keyword = m_previous;

                std::unique_ptr<Pattern> casePattern = std::make_unique<WildcardPattern>(keyword);
                std::unique_ptr<Expr> casePredicate = consume(TokenType::WHEN)
                                                      ? parseExpr()
                                                      : std::make_unique<BooleanExpr>(true);
                std::unique_ptr<BlockExpr> caseBody = expectBlock("Expected '{' or '=>' before default switch case body.");

                cases.push_back(SwitchCase{std::move(casePattern),
                                           std::move(casePredicate),
                                           std::move(caseBody),
                                           std::move(keyword)});
            }
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after switch expression body.");

        return std::make_unique<SwitchExpr>(std::move(value), std::move(cases));
    }